

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot_i.hpp
# Opt level: O2

Gnuplot * __thiscall Gnuplot::set_xrange(Gnuplot *this,double iFrom,double iTo)

{
  ostream *poVar1;
  ostringstream local_1c0 [8];
  ostringstream cmdstr;
  string local_48;
  double local_28;
  double local_20;
  
  local_28 = iFrom;
  local_20 = iTo;
  std::__cxx11::ostringstream::ostringstream(local_1c0);
  std::operator<<((ostream *)local_1c0,"set xrange[");
  poVar1 = std::ostream::_M_insert<double>(local_28);
  std::operator<<(poVar1,":");
  poVar1 = std::ostream::_M_insert<double>(local_20);
  std::operator<<(poVar1,"]");
  std::__cxx11::stringbuf::str();
  cmd(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::ostringstream::~ostringstream(local_1c0);
  return this;
}

Assistant:

Gnuplot& Gnuplot::set_xrange(const double iFrom, const double iTo) {
  std::ostringstream cmdstr;

  cmdstr << "set xrange[" << iFrom << ":" << iTo << "]";
  cmd(cmdstr.str());

  return *this;
}